

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationRootElements::getPrimaryBefore
          (CollationRootElements *this,uint32_t p,UBool isCompressible)

{
  uint32_t nextElement;
  uint32_t q;
  int32_t step;
  int32_t index;
  UBool isCompressible_local;
  uint32_t p_local;
  CollationRootElements *this_local;
  
  q = findPrimary(this,p);
  if (p == (this->elements[(int)q] & 0xffffff00)) {
    nextElement = this->elements[(int)q] & 0x7f;
    if (nextElement == 0) {
      do {
        q = q - 1;
      } while ((this->elements[(int)q] & 0x80) != 0);
      return this->elements[(int)q] & 0xffffff00;
    }
  }
  else {
    nextElement = this->elements[(int)(q + 1)] & 0x7f;
  }
  if ((p & 0xffff) == 0) {
    this_local._4_4_ = Collation::decTwoBytePrimaryByOneStep(p,isCompressible,nextElement);
  }
  else {
    this_local._4_4_ = Collation::decThreeBytePrimaryByOneStep(p,isCompressible,nextElement);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationRootElements::getPrimaryBefore(uint32_t p, UBool isCompressible) const {
    int32_t index = findPrimary(p);
    int32_t step;
    uint32_t q = elements[index];
    if(p == (q & 0xffffff00)) {
        // Found p itself. Return the previous primary.
        // See if p is at the end of a previous range.
        step = (int32_t)q & PRIMARY_STEP_MASK;
        if(step == 0) {
            // p is not at the end of a range. Look for the previous primary.
            do {
                p = elements[--index];
            } while((p & SEC_TER_DELTA_FLAG) != 0);
            return p & 0xffffff00;
        }
    } else {
        // p is in a range, and not at the start.
        uint32_t nextElement = elements[index + 1];
        U_ASSERT(isEndOfPrimaryRange(nextElement));
        step = (int32_t)nextElement & PRIMARY_STEP_MASK;
    }
    // Return the previous range primary.
    if((p & 0xffff) == 0) {
        return Collation::decTwoBytePrimaryByOneStep(p, isCompressible, step);
    } else {
        return Collation::decThreeBytePrimaryByOneStep(p, isCompressible, step);
    }
}